

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

int __thiscall
google::protobuf::io::IstreamInputStream::CopyingIstreamInputStream::Read
          (CopyingIstreamInputStream *this,void *buffer,int size)

{
  istream *piVar1;
  int iVar2;
  
  std::istream::read((char *)this->input_,(long)buffer);
  piVar1 = this->input_;
  if ((*(int *)(piVar1 + 8) != 0) ||
     (iVar2 = -1,
     (*(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) & 5) == 0 ||
     (*(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) & 2) != 0)) {
    iVar2 = *(int *)(piVar1 + 8);
  }
  return iVar2;
}

Assistant:

int IstreamInputStream::CopyingIstreamInputStream::Read(void* buffer,
                                                        int size) {
  input_->read(reinterpret_cast<char*>(buffer), size);
  int result = input_->gcount();
  if (result == 0 && input_->fail() && !input_->eof()) {
    return -1;
  }
  return result;
}